

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void read_bytes<int>(void *ptr,size_t n_els,istream *in)

{
  ulong uVar1;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  
  if (in_RSI != 0) {
    std::istream::read(in_RDX,in_RDI);
    uVar1 = std::ios::bad();
    if ((uVar1 & 1) != 0) {
      throw_errno();
    }
  }
  return;
}

Assistant:

void read_bytes(void *ptr, const size_t n_els, std::istream &in)
{
    if (n_els == 0) return;
    in.read((char*)ptr, n_els * sizeof(dtype));
    if (unlikely(in.bad())) throw_errno();
}